

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::ICUService::getDisplayName
          (ICUService *this,UnicodeString *id,UnicodeString *result,Locale *locale)

{
  char cVar1;
  int iVar2;
  Hashtable *this_00;
  long *plVar3;
  undefined4 extraout_var;
  bool bVar4;
  undefined1 local_b0 [8];
  UnicodeString us;
  ICUServiceKey *fallbackKey;
  ICUServiceFactory *f;
  Hashtable *map;
  Mutex mutex;
  UErrorCode status;
  Locale *locale_local;
  UnicodeString *result_local;
  UnicodeString *id_local;
  ICUService *this_local;
  
  mutex.fMutex._4_4_ = 0;
  Mutex::Mutex((Mutex *)&map,(UMutex *)icu_63::lock);
  this_00 = getVisibleIDMap(this,(UErrorCode *)((long)&mutex.fMutex + 4));
  if (this_00 == (Hashtable *)0x0) {
LAB_00359a5f:
    bVar4 = false;
  }
  else {
    plVar3 = (long *)Hashtable::get(this_00,id);
    if (plVar3 == (long *)0x0) {
      mutex.fMutex._4_4_ = 0;
      iVar2 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xd])
                        (this,id,(undefined1 *)((long)&mutex.fMutex + 4));
      us.fUnion._48_8_ = CONCAT44(extraout_var,iVar2);
      do {
        bVar4 = false;
        if (us.fUnion._48_8_ != 0) {
          cVar1 = (**(code **)(*(long *)us.fUnion._48_8_ + 0x38))();
          bVar4 = cVar1 != '\0';
        }
        if (!bVar4) {
          if (us.fUnion._48_8_ != 0) {
            (**(code **)(*(long *)us.fUnion._48_8_ + 8))();
          }
          goto LAB_00359a5f;
        }
        UnicodeString::UnicodeString((UnicodeString *)local_b0);
        (**(code **)(*(long *)us.fUnion._48_8_ + 0x28))(us.fUnion._48_8_,local_b0);
        plVar3 = (long *)Hashtable::get(this_00,(UnicodeString *)local_b0);
        if (plVar3 == (long *)0x0) {
          bVar4 = false;
        }
        else {
          (**(code **)(*plVar3 + 0x28))(plVar3,id,locale,result);
          if (us.fUnion._48_8_ != 0) {
            (**(code **)(*(long *)us.fUnion._48_8_ + 8))();
          }
          bVar4 = true;
          this_local = (ICUService *)result;
        }
        UnicodeString::~UnicodeString((UnicodeString *)local_b0);
      } while (!bVar4);
    }
    else {
      (**(code **)(*plVar3 + 0x28))(plVar3,id,locale,result);
      bVar4 = true;
      this_local = (ICUService *)result;
    }
  }
  Mutex::~Mutex((Mutex *)&map);
  if (!bVar4) {
    UnicodeString::setToBogus(result);
    this_local = (ICUService *)result;
  }
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString& 
ICUService::getDisplayName(const UnicodeString& id, UnicodeString& result, const Locale& locale) const 
{
    {
        UErrorCode status = U_ZERO_ERROR;
        Mutex mutex(&lock);
        const Hashtable* map = getVisibleIDMap(status);
        if (map != NULL) {
            ICUServiceFactory* f = (ICUServiceFactory*)map->get(id);
            if (f != NULL) {
                f->getDisplayName(id, locale, result);
                return result;
            }

            // fallback
            status = U_ZERO_ERROR;
            ICUServiceKey* fallbackKey = createKey(&id, status);
            while (fallbackKey != NULL && fallbackKey->fallback()) {
                UnicodeString us;
                fallbackKey->currentID(us);
                f = (ICUServiceFactory*)map->get(us);
                if (f != NULL) {
                    f->getDisplayName(id, locale, result);
                    delete fallbackKey;
                    return result;
                }
            }
            delete fallbackKey;
        }
    }
    result.setToBogus();
    return result;
}